

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

bool __thiscall Js::PathTypeHandlerBase::HasSingletonInstance(PathTypeHandlerBase *this)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  uint16 uVar4;
  undefined4 *puVar5;
  TypePath *pTVar6;
  bool local_21;
  PathTypeHandlerBase *this_local;
  
  bVar2 = HasSingletonInstanceOnlyIfNeeded(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xbe1,"(HasSingletonInstanceOnlyIfNeeded())",
                                "HasSingletonInstanceOnlyIfNeeded()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = FixPropsOnPathTypes();
  if (bVar2) {
    pTVar6 = GetTypePath(this);
    bVar2 = TypePath::HasSingletonInstance(pTVar6);
    local_21 = false;
    if (bVar2) {
      uVar4 = GetPathLength(this);
      pTVar6 = GetTypePath(this);
      bVar3 = TypePath::GetMaxInitializedLength(pTVar6);
      local_21 = bVar3 <= uVar4;
    }
    this_local._7_1_ = local_21;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool PathTypeHandlerBase::HasSingletonInstance() const
    {
        Assert(HasSingletonInstanceOnlyIfNeeded());
        if (!FixPropsOnPathTypes())
        {
            return false;
        }

        return this->GetTypePath()->HasSingletonInstance() && GetPathLength() >= this->GetTypePath()->GetMaxInitializedLength();
    }